

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::
int_writer<long_long>
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this,
          buffer_appender<char> output,locale_ref loc,longlong value,basic_format_specs<char> *s)

{
  bool bVar1;
  longlong in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined1 local_31;
  
  *in_RDI = in_RSI;
  in_RDI[1] = CONCAT71(in_register_00000011,in_DL);
  in_RDI[2] = in_R8;
  in_RDI[3] = in_RCX;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  bVar1 = is_negative<long_long,_0>(in_RCX);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 4) = 0x2d;
    *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + 1;
    in_RDI[3] = -in_RDI[3];
  }
  else if (((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 0) && ((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 1))
  {
    local_31 = 0x2b;
    if ((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 2) {
      local_31 = 0x20;
    }
    *(undefined1 *)(in_RDI + 4) = local_31;
    *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + 1;
  }
  return;
}

Assistant:

int_writer(OutputIt output, locale_ref loc, Int value,
             const basic_format_specs<Char>& s)
      : out(output),
        locale(loc),
        specs(s),
        abs_value(static_cast<UInt>(value)),
        prefix_size(0) {
    static_assert(std::is_same<uint32_or_64_or_128_t<Int>, UInt>::value, "");
    if (is_negative(value)) {
      prefix[0] = '-';
      ++prefix_size;
      abs_value = 0 - abs_value;
    } else if (specs.sign != sign::none && specs.sign != sign::minus) {
      prefix[0] = specs.sign == sign::plus ? '+' : ' ';
      ++prefix_size;
    }
  }